

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

Float __thiscall
pbrt::TrowbridgeReitzDistribution::Lambda(TrowbridgeReitzDistribution *this,Vector3f *w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  fVar9 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar9 = fVar9 * fVar9;
  auVar11._0_12_ = ZEXT812(0);
  auVar11._12_4_ = 0;
  auVar12 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar9)),auVar11);
  auVar10._0_4_ = auVar12._0_4_ / fVar9;
  auVar10._4_12_ = auVar12._4_12_;
  if (ABS(auVar10._0_4_) != INFINITY) {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    if ((auVar12._0_4_ != 0.0) || (NAN(auVar12._0_4_))) {
      uVar1 = (w->super_Tuple3<pbrt::Vector3,_float>).x;
      uVar2 = (w->super_Tuple3<pbrt::Vector3,_float>).y;
      auVar14._4_4_ = uVar2;
      auVar14._0_4_ = uVar1;
      auVar14._8_8_ = 0;
      auVar12._4_4_ = auVar12._0_4_;
      auVar12._8_4_ = auVar12._0_4_;
      auVar12._12_4_ = auVar12._0_4_;
      auVar16._8_4_ = 0x3f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._12_4_ = 0x3f800000;
      auVar12 = vdivps_avx(auVar14,auVar12);
      auVar15._8_4_ = 0xbf800000;
      auVar15._0_8_ = 0xbf800000bf800000;
      auVar15._12_4_ = 0xbf800000;
      fVar9 = this->alpha_x * this->alpha_x;
      uVar4 = vcmpps_avx512vl(auVar12,auVar15,1);
      auVar12 = vminps_avx(auVar16,auVar12);
      bVar3 = (bool)((byte)uVar4 & 1);
      fVar5 = (float)((uint)bVar3 * -0x40800000 | (uint)!bVar3 * auVar12._0_4_);
      bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
      fVar6 = (float)((uint)bVar3 * -0x40800000 | (uint)!bVar3 * auVar12._4_4_);
      bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
      fVar7 = (float)((uint)bVar3 * -0x40800000 | (uint)!bVar3 * auVar12._8_4_);
      bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
      fVar8 = (float)((uint)bVar3 * -0x40800000 | (uint)!bVar3 * auVar12._12_4_);
      auVar13._0_4_ = fVar5 * fVar5;
      auVar13._4_4_ = fVar6 * fVar6;
      auVar13._8_4_ = fVar7 * fVar7;
      auVar13._12_4_ = fVar8 * fVar8;
    }
    else {
      auVar13 = SUB6416(ZEXT464(0x3f800000),0);
      fVar9 = this->alpha_x * this->alpha_x;
    }
    auVar12 = vmovshdup_avx(auVar13);
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * this->alpha_y * this->alpha_y)),auVar13
                              ,ZEXT416((uint)fVar9));
    auVar12 = vfmadd213ss_fma(auVar10,auVar12,ZEXT416(0x3f800000));
    if (auVar12._0_4_ < 0.0) {
      fVar9 = sqrtf(auVar12._0_4_);
    }
    else {
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      fVar9 = auVar12._0_4_;
    }
    auVar11 = ZEXT416((uint)((fVar9 + -1.0) * 0.5));
  }
  return auVar11._0_4_;
}

Assistant:

PBRT_CPU_GPU
inline Float Cos2Theta(const Vector3f &w) {
    return w.z * w.z;
}